

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferStringBuilder.cpp
# Opt level: O2

void __thiscall
Js::BufferStringBuilder::WritableString::SetContent
          (WritableString *this,char16 *prefix,charcount_t cchPrefix,char16 *content,
          charcount_t cchContent,char16 *suffix,charcount_t cchSuffix)

{
  char16 *pcVar1;
  charcount_t local_44;
  char16 *pcStack_40;
  charcount_t cchRemain;
  charcount_t local_34;
  
  pcStack_40 = suffix;
  local_34 = cchContent;
  pcVar1 = JavascriptString::UnsafeGetBuffer(&this->super_JavascriptString);
  local_44 = JavascriptString::GetLength(&this->super_JavascriptString);
  pcVar1 = SafeCopyAndAdvancePtr(pcVar1,&local_44,prefix,cchPrefix);
  pcVar1 = SafeCopyAndAdvancePtr(pcVar1,&local_44,content,local_34);
  SafeCopyAndAdvancePtr(pcVar1,&local_44,pcStack_40,cchSuffix);
  return;
}

Assistant:

void BufferStringBuilder::WritableString::SetContent(
            const char16* prefix, charcount_t cchPrefix,
            const char16* content, charcount_t cchContent,
            const char16* suffix, charcount_t cchSuffix)
    {
        char16* dst = GetWritableBuffer();

        charcount_t cchRemain = GetLength();
        dst = SafeCopyAndAdvancePtr(dst, cchRemain, prefix, cchPrefix);
        dst = SafeCopyAndAdvancePtr(dst, cchRemain, content, cchContent);
        (void)SafeCopyAndAdvancePtr(dst, cchRemain, suffix, cchSuffix);
    }